

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall
pbrt::CameraBase::ApproximatedPdxy(CameraBase *this,SurfaceInteraction *si,int samplesPerPixel)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar22 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar5 [16];
  undefined1 auVar14 [64];
  undefined1 auVar6 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar7 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined8 uVar21;
  undefined1 auVar20 [64];
  float fVar23;
  undefined1 in_ZMM1 [64];
  undefined1 auVar24 [64];
  undefined1 auVar27 [60];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 in_register_00001444 [12];
  Point3f PVar28;
  Normal3f NVar29;
  Vector3<float> VVar30;
  Point3<float> PVar31;
  Normal3<float> NVar32;
  Point3f PVar33;
  Vector3f VVar34;
  Transform DownZFromCamera;
  undefined1 local_1c8 [16];
  undefined1 local_1a8 [16];
  float local_198;
  float local_188;
  Tuple3<pbrt::Vector3,_float> local_178;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  Tuple3<pbrt::Vector3,_float> local_130;
  Tuple3<pbrt::Normal3,_float> local_120;
  Tuple3<pbrt::Point3,_float> local_110;
  Ray local_100;
  Ray local_d8;
  Transform local_b0;
  
  auVar27 = in_ZMM1._4_60_;
  auVar22 = in_ZMM0._8_56_;
  PVar28 = Interaction::p(&si->super_Interaction);
  local_b0.m.m[0][2] = PVar28.super_Tuple3<pbrt::Point3,_float>.z;
  auVar10._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar22;
  local_b0.m.m[0]._0_8_ = vmovlps_avx(auVar10._0_16_);
  auVar22 = (undefined1  [56])0x0;
  PVar28 = CameraTransform::CameraFromRender
                     (&this->cameraTransform,(Point3f *)&local_b0,(si->super_Interaction).time);
  auVar11._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar22;
  local_110._0_8_ = vmovlps_avx(auVar11._0_16_);
  auVar22 = (undefined1  [56])0x0;
  local_110.z = PVar28.super_Tuple3<pbrt::Point3,_float>.z;
  NVar29 = CameraTransform::CameraFromRender
                     (&this->cameraTransform,&(si->super_Interaction).n,(si->super_Interaction).time
                     );
  local_120.z = NVar29.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar12._0_8_ = NVar29.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar12._8_56_ = auVar22;
  local_120._0_8_ = vmovlps_avx(auVar12._0_16_);
  local_d8.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar11._0_16_);
  auVar22 = (undefined1  [56])0x0;
  local_d8.o.super_Tuple3<pbrt::Point3,_float>.z = PVar28.super_Tuple3<pbrt::Point3,_float>.z;
  VVar30 = Normalize<float>((Vector3<float> *)&local_d8);
  local_188 = 1.0;
  RotateFromTo(&local_b0,(Vector3f)VVar30.super_Tuple3<pbrt::Vector3,_float>,
               (Vector3f)(ZEXT412(0x3f800000) << 0x40));
  PVar31 = Transform::operator()(&local_b0,(Point3<float> *)&local_110);
  fVar23 = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar13._8_56_ = auVar22;
  auVar5 = auVar13._0_16_;
  auVar8 = vmovshdup_avx(auVar5);
  auVar22 = ZEXT856(auVar8._8_8_);
  NVar32 = Transform::operator()(&local_b0,(Normal3<float> *)&local_120);
  auVar24._0_4_ = NVar32.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar24._4_60_ = auVar27;
  auVar14._0_8_ = NVar32.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar14._8_56_ = auVar22;
  auVar6 = auVar14._0_16_;
  local_168 = vmovshdup_avx(auVar6);
  local_100.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_100.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_100.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  auVar8 = vfmadd213ss_fma(auVar8,local_168,ZEXT416((uint)(fVar23 * auVar24._0_4_)));
  auVar3 = vfmsub231ss_fma(ZEXT416((uint)(fVar23 * auVar24._0_4_)),auVar24._0_16_,
                           ZEXT416((uint)fVar23));
  local_198 = PVar31.super_Tuple3<pbrt::Point3,_float>.x;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ + auVar3._0_4_)),auVar6,
                           ZEXT416((uint)local_198));
  auVar22 = ZEXT856(auVar9._8_8_);
  auVar10 = auVar24;
  PVar31 = Point3<float>::operator+(&local_100.o,&this->minPosDifferentialX);
  auVar27 = auVar10._4_60_;
  auVar15._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar15._8_56_ = auVar22;
  local_148 = auVar15._0_16_;
  local_158._0_4_ = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
  local_178.x = 0.0;
  local_178.y = 0.0;
  local_178.z = 1.0;
  VVar30 = Tuple3<pbrt::Vector3,float>::operator+(&local_178,&this->minDirDifferentialX);
  auVar25._0_4_ = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar25._4_60_ = auVar27;
  auVar16._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar22;
  local_178.x = 0.0;
  local_178.y = 0.0;
  local_178.z = 0.0;
  local_d8.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(local_148);
  auVar8 = vmovshdup_avx(local_148);
  local_d8.o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_158._0_4_;
  auVar7 = auVar16._0_16_;
  local_d8.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar7);
  local_d8.time = 0.0;
  local_d8.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  auVar3 = vfmadd213ss_fma(auVar8,local_168,ZEXT416((uint)(auVar24._0_4_ * (float)local_158._0_4_)))
  ;
  auVar1 = vfmsub213ss_fma(ZEXT416((uint)local_158._0_4_),ZEXT416((uint)auVar24._0_4_),
                           ZEXT416((uint)(auVar24._0_4_ * (float)local_158._0_4_)));
  auVar8 = vmovshdup_avx(auVar7);
  auVar2 = vfmsub213ss_fma(auVar25._0_16_,ZEXT416((uint)auVar24._0_4_),
                           ZEXT416((uint)(auVar24._0_4_ * auVar25._0_4_)));
  auVar8 = vfmadd213ss_fma(auVar8,local_168,ZEXT416((uint)(auVar24._0_4_ * auVar25._0_4_)));
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ + auVar3._0_4_)),auVar6,local_148);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ + auVar2._0_4_)),auVar6,auVar7);
  auVar27 = ZEXT1260(auVar8._4_12_);
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(ZEXT416((uint)(auVar3._0_4_ - auVar9._0_4_)),auVar1);
  auVar22 = ZEXT856(auVar3._8_8_);
  local_148._0_4_ = auVar3._0_4_ / auVar8._0_4_;
  local_d8.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar25._0_4_;
  PVar31 = Point3<float>::operator+((Point3<float> *)&local_178,&this->minPosDifferentialY);
  fVar4 = PVar31.super_Tuple3<pbrt::Point3,_float>.z;
  auVar17._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar17._8_56_ = auVar22;
  local_158 = auVar17._0_16_;
  local_130.x = 0.0;
  local_130.y = 0.0;
  local_130.z = 1.0;
  VVar30 = Tuple3<pbrt::Vector3,float>::operator+(&local_130,&this->minDirDifferentialY);
  auVar26._0_4_ = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._4_60_ = auVar27;
  auVar18._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar22;
  local_100.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(local_158);
  auVar8 = vmovshdup_avx(local_158);
  auVar7 = auVar18._0_16_;
  local_100.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar7);
  local_100.time = 0.0;
  local_100.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  auVar3 = vfmadd213ss_fma(auVar8,local_168,ZEXT416((uint)(auVar24._0_4_ * fVar4)));
  auVar1 = vfmsub213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)auVar24._0_4_),
                           ZEXT416((uint)(auVar24._0_4_ * fVar4)));
  auVar8 = vmovshdup_avx(auVar7);
  auVar2 = vfmsub213ss_fma(auVar26._0_16_,ZEXT416((uint)auVar24._0_4_),
                           ZEXT416((uint)(auVar24._0_4_ * auVar26._0_4_)));
  auVar8 = vfmadd213ss_fma(auVar8,local_168,ZEXT416((uint)(auVar24._0_4_ * auVar26._0_4_)));
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ + auVar3._0_4_)),auVar6,local_158);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ + auVar2._0_4_)),auVar6,auVar7);
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(ZEXT416((uint)(auVar3._0_4_ - auVar9._0_4_)),auVar2);
  local_1a8._8_8_ = 0;
  local_100.o.super_Tuple3<pbrt::Point3,_float>.z = fVar4;
  local_100.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar26._0_4_;
  PVar28 = Ray::operator()(&local_d8,(Float)local_148._0_4_);
  local_1a8._0_8_ = PVar28.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_1c8._8_8_ = 0;
  PVar33 = Ray::operator()(&local_100,auVar3._0_4_ / auVar8._0_4_);
  local_1c8._0_8_ = PVar33.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_168._0_4_ = PVar33.super_Tuple3<pbrt::Point3,_float>.z;
  if (*(char *)(Options + 5) == '\0') {
    auVar8._0_4_ = (float)samplesPerPixel;
    auVar8._4_12_ = in_register_00001444;
    if (auVar8._0_4_ < 0.0) {
      fVar4 = sqrtf(auVar8._0_4_);
    }
    else {
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar4 = auVar8._0_4_;
    }
    auVar8 = vmaxss_avx(ZEXT416((uint)(1.0 / fVar4)),ZEXT416(0x3e000000));
    local_188 = auVar8._0_4_;
  }
  auVar8 = vsubps_avx(local_1a8,auVar5);
  auVar22 = ZEXT856(auVar8._8_8_);
  local_130.z = PVar28.super_Tuple3<pbrt::Point3,_float>.z - fVar23;
  local_130._0_8_ = vmovlps_avx(auVar8);
  VVar30 = Transform::ApplyInverse<float>(&local_b0,(Vector3<float> *)&local_130);
  local_178.z = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar22;
  local_178._0_8_ = vmovlps_avx(auVar19._0_16_);
  uVar21 = 0;
  VVar34 = CameraTransform::RenderFromCamera
                     (&this->cameraTransform,(Vector3f *)&local_178,(si->super_Interaction).time);
  auVar3._0_4_ = local_188 * VVar34.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar3._4_4_ = local_188 * VVar34.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar3._8_4_ = local_188 * (float)uVar21;
  auVar3._12_4_ = local_188 * (float)((ulong)uVar21 >> 0x20);
  uVar21 = vmovlps_avx(auVar3);
  (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar21;
  (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar21 >> 0x20);
  (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.z =
       local_188 * VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8 = vsubps_avx(local_1c8,auVar5);
  auVar22 = ZEXT856(auVar8._8_8_);
  local_130.z = (float)local_168._0_4_ - fVar23;
  local_130._0_8_ = vmovlps_avx(auVar8);
  VVar30 = Transform::ApplyInverse<float>(&local_b0,(Vector3<float> *)&local_130);
  local_178.z = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar22;
  local_178._0_8_ = vmovlps_avx(auVar20._0_16_);
  uVar21 = 0;
  VVar34 = CameraTransform::RenderFromCamera
                     (&this->cameraTransform,(Vector3f *)&local_178,(si->super_Interaction).time);
  auVar9._0_4_ = VVar34.super_Tuple3<pbrt::Vector3,_float>.x * local_188;
  auVar9._4_4_ = VVar34.super_Tuple3<pbrt::Vector3,_float>.y * local_188;
  auVar9._8_4_ = (float)uVar21 * local_188;
  auVar9._12_4_ = (float)((ulong)uVar21 >> 0x20) * local_188;
  uVar21 = vmovlps_avx(auVar9);
  (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar21;
  (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar21 >> 0x20);
  (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar34.super_Tuple3<pbrt::Vector3,_float>.z * local_188;
  return;
}

Assistant:

void CameraBase::ApproximatedPdxy(SurfaceInteraction &si, int samplesPerPixel) const {
    // Compute tangent plane equation for ray differential intersections
    Point3f pCamera = CameraFromRender(si.p(), si.time);
    Normal3f nCamera = CameraFromRender(si.n, si.time);
    Transform DownZFromCamera =
        RotateFromTo(Normalize(Vector3f(pCamera)), Vector3f(0, 0, 1));
    Point3f pDownZ = DownZFromCamera(pCamera);
    Normal3f nDownZ = DownZFromCamera(nCamera);
    Float d = Dot(nDownZ, Vector3f(pDownZ));

    // Find intersection points for approximated camera differential rays
    Ray xRay(Point3f(0, 0, 0) + minPosDifferentialX,
             Vector3f(0, 0, 1) + minDirDifferentialX);
    Float tx = -(Dot(nDownZ, Vector3f(xRay.o)) - d) / Dot(nDownZ, xRay.d);
    Ray yRay(Point3f(0, 0, 0) + minPosDifferentialY,
             Vector3f(0, 0, 1) + minDirDifferentialY);
    Float ty = -(Dot(nDownZ, Vector3f(yRay.o)) - d) / Dot(nDownZ, yRay.d);
    Point3f px = xRay(tx), py = yRay(ty);

    // Estimate $\dpdx$ and $\dpdy$ in tangent plane at intersection point
    Float sppScale = GetOptions().disablePixelJitter
                         ? 1
                         : std::max<Float>(.125, 1 / std::sqrt((Float)samplesPerPixel));
    si.dpdx =
        sppScale * RenderFromCamera(DownZFromCamera.ApplyInverse(px - pDownZ), si.time);
    si.dpdy =
        sppScale * RenderFromCamera(DownZFromCamera.ApplyInverse(py - pDownZ), si.time);
}